

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall
Darts::DoubleArrayImpl<void,void,int,void>::
commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
          (DoubleArrayImpl<void,void,int,void> *this,key_type *key,result_pair_type *results,
          size_t max_num_results,size_t length,size_t node_pos)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  
  lVar3 = *(long *)(this + 0x10);
  uVar2 = *(uint *)(lVar3 + node_pos * 4);
  uVar6 = (uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8) ^ node_pos;
  if (length == 0) {
    sVar5 = 1;
    sVar4 = 0;
    while( true ) {
      bVar1 = key[sVar5 - 1];
      if ((ulong)bVar1 == 0) break;
      uVar6 = uVar6 ^ bVar1;
      uVar2 = *(uint *)(lVar3 + uVar6 * 4);
      if ((uVar2 & 0x800000ff) != (uint)bVar1) {
        return sVar4;
      }
      uVar6 = uVar6 ^ (uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8);
      if ((uVar2 >> 8 & 1) != 0) {
        if (sVar4 < max_num_results) {
          results[sVar4].value = *(uint *)(lVar3 + uVar6 * 4) & 0x7fffffff;
          results[sVar4].length = sVar5;
        }
        sVar4 = sVar4 + 1;
      }
      sVar5 = sVar5 + 1;
    }
  }
  else {
    sVar4 = 0;
    for (sVar5 = 1; sVar5 - length != 1; sVar5 = sVar5 + 1) {
      uVar6 = uVar6 ^ (byte)key[sVar5 - 1];
      uVar2 = *(uint *)(lVar3 + uVar6 * 4);
      if ((uVar2 & 0x800000ff) != (uint)(byte)key[sVar5 - 1]) {
        return sVar4;
      }
      uVar6 = uVar6 ^ (uVar2 >> 10) << ((byte)(uVar2 >> 6) & 8);
      if ((uVar2 >> 8 & 1) != 0) {
        if (sVar4 < max_num_results) {
          results[sVar4].value = *(uint *)(lVar3 + uVar6 * 4) & 0x7fffffff;
          results[sVar4].length = sVar5;
        }
        sVar4 = sVar4 + 1;
      }
    }
  }
  return sVar4;
}

Assistant:

inline std::size_t DoubleArrayImpl<A, B, T, C>::commonPrefixSearch(
    const key_type *key, U *results, std::size_t max_num_results,
    std::size_t length, std::size_t node_pos) const {
  std::size_t num_results = 0;

  unit_type unit = array_[node_pos];
  node_pos ^= unit.offset();
  if (length != 0) {
    for (std::size_t i = 0; i < length; ++i) {
      node_pos ^= static_cast<uchar_type>(key[i]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[i])) {
        return num_results;
      }

      node_pos ^= unit.offset();
      if (unit.has_leaf()) {
        if (num_results < max_num_results) {
          set_result(&results[num_results], static_cast<value_type>(
              array_[node_pos].value()), i + 1);
        }
        ++num_results;
      }
    }
  } else {
    for ( ; key[length] != '\0'; ++length) {
      node_pos ^= static_cast<uchar_type>(key[length]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[length])) {
        return num_results;
      }

      node_pos ^= unit.offset();
      if (unit.has_leaf()) {
        if (num_results < max_num_results) {
          set_result(&results[num_results], static_cast<value_type>(
              array_[node_pos].value()), length + 1);
        }
        ++num_results;
      }
    }
  }

  return num_results;
}